

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utf8collationiterator.cpp
# Opt level: O1

UChar32 __thiscall
icu_63::FCDUTF8CollationIterator::nextCodePoint
          (FCDUTF8CollationIterator *this,UErrorCode *errorCode)

{
  long lVar1;
  int32_t *piVar2;
  byte bVar3;
  short sVar4;
  State SVar5;
  uint8_t *puVar6;
  UBool UVar7;
  uint uVar8;
  uint uVar9;
  byte bVar10;
  long lVar11;
  int iVar12;
  int iVar13;
  
  do {
    while (SVar5 = this->state, SVar5 == IN_NORMALIZED) {
      sVar4 = (this->normalized).fUnion.fStackFields.fLengthAndFlags;
      if (sVar4 < 0) {
        iVar12 = (this->normalized).fUnion.fFields.fLength;
      }
      else {
        iVar12 = (int)sVar4 >> 5;
      }
      iVar13 = (this->super_UTF8CollationIterator).pos;
      if (iVar13 != iVar12) {
        uVar9 = UnicodeString::char32At(&this->normalized,iVar13);
        iVar12 = ((this->super_UTF8CollationIterator).pos - (uint)(uVar9 < 0x10000)) + 2;
LAB_00222589:
        (this->super_UTF8CollationIterator).pos = iVar12;
        return uVar9;
      }
LAB_0022234f:
      switchToForward(this);
    }
    if (SVar5 == IN_FCD_SEGMENT) {
      iVar12 = (this->super_UTF8CollationIterator).pos;
      lVar11 = (long)iVar12;
      if (iVar12 != this->limit) {
        puVar6 = (this->super_UTF8CollationIterator).u8;
        lVar1 = lVar11 + 1;
        (this->super_UTF8CollationIterator).pos = (int)lVar1;
        bVar3 = puVar6[lVar11];
        uVar9 = (uint)bVar3;
        if (-1 < (char)bVar3) {
          return uVar9;
        }
        iVar12 = (this->super_UTF8CollationIterator).length;
        uVar8 = 0xfffd;
        if ((int)lVar1 == iVar12) {
          return 0xfffd;
        }
        if (bVar3 < 0xe0) {
          if (bVar3 < 0xc2) {
            return 0xfffd;
          }
          uVar9 = uVar9 & 0x1f;
        }
        else {
          if (bVar3 < 0xf0) {
            uVar9 = uVar9 & 0xf;
            if (((byte)" 000000000000\x1000"[uVar9] >> (puVar6[lVar1] >> 5) & 1) == 0) {
              return 0xfffd;
            }
            bVar10 = puVar6[lVar1] & 0x3f;
          }
          else {
            if (0xf4 < bVar3) {
              return 0xfffd;
            }
            bVar3 = puVar6[lVar1];
            if (((uint)(int)""[bVar3 >> 4] >> (uVar9 - 0xf0 & 0x1f) & 1) == 0) {
              return 0xfffd;
            }
            iVar13 = (int)(lVar11 + 2);
            (this->super_UTF8CollationIterator).pos = iVar13;
            if (iVar13 == iVar12) {
              return 0xfffd;
            }
            bVar10 = puVar6[lVar11 + 2] + 0x80;
            if (0x3f < bVar10) {
              return 0xfffd;
            }
            uVar9 = bVar3 & 0x3f | (uVar9 - 0xf0) * 0x40;
          }
          iVar13 = (this->super_UTF8CollationIterator).pos + 1;
          (this->super_UTF8CollationIterator).pos = iVar13;
          if (iVar13 == iVar12) {
            return 0xfffd;
          }
          uVar9 = (uint)bVar10 | uVar9 << 6;
        }
        iVar12 = (this->super_UTF8CollationIterator).pos;
        if ((byte)(puVar6[iVar12] ^ 0x80) < 0x40) {
          uVar8 = uVar9 << 6 | puVar6[iVar12] ^ 0x80;
          (this->super_UTF8CollationIterator).pos = iVar12 + 1;
        }
        return uVar8;
      }
      goto LAB_0022234f;
    }
    if (SVar5 != CHECK_FWD) goto LAB_0022234f;
    iVar12 = (this->super_UTF8CollationIterator).pos;
    lVar11 = (long)iVar12;
    iVar13 = (this->super_UTF8CollationIterator).length;
    if (iVar12 == iVar13) {
      return -1;
    }
    puVar6 = (this->super_UTF8CollationIterator).u8;
    bVar3 = puVar6[lVar11];
    if ((iVar13 < 0) && (bVar3 == 0)) {
      return -1;
    }
    if (-1 < (char)bVar3) {
      uVar9 = (uint)bVar3;
      iVar12 = iVar12 + 1;
      goto LAB_00222589;
    }
    lVar1 = lVar11 + 1;
    (this->super_UTF8CollationIterator).pos = (int)lVar1;
    bVar3 = puVar6[lVar11];
    uVar8 = (uint)bVar3;
    uVar9 = uVar8;
    if (((char)bVar3 < '\0') && (uVar9 = 0xfffd, (int)lVar1 != iVar13)) {
      if (bVar3 < 0xe0) {
        if (0xc1 < bVar3) {
          uVar8 = uVar8 & 0x1f;
LAB_002224af:
          iVar12 = (this->super_UTF8CollationIterator).pos;
          bVar3 = puVar6[iVar12];
          if ((byte)(bVar3 ^ 0x80) < 0x40) {
            (this->super_UTF8CollationIterator).pos = iVar12 + 1;
            uVar9 = uVar8 << 6 | bVar3 ^ 0x80;
          }
        }
      }
      else if (bVar3 < 0xf0) {
        uVar8 = uVar8 & 0xf;
        if (((byte)" 000000000000\x1000"[uVar8] >> (puVar6[lVar1] >> 5) & 1) != 0) {
          bVar10 = puVar6[lVar1] & 0x3f;
LAB_00222480:
          iVar12 = (this->super_UTF8CollationIterator).pos + 1;
          (this->super_UTF8CollationIterator).pos = iVar12;
          if (iVar12 != iVar13) {
            uVar8 = (uint)bVar10 | uVar8 << 6;
            goto LAB_002224af;
          }
        }
      }
      else if (bVar3 < 0xf5) {
        bVar3 = puVar6[lVar1];
        if (((uint)(int)""[bVar3 >> 4] >> (uVar8 - 0xf0 & 0x1f) & 1) != 0) {
          iVar12 = (int)(lVar11 + 2);
          (this->super_UTF8CollationIterator).pos = iVar12;
          if ((iVar12 != iVar13) && (bVar10 = puVar6[lVar11 + 2] + 0x80, bVar10 < 0x40)) {
            uVar8 = bVar3 & 0x3f | (uVar8 - 0xf0) * 0x40;
            goto LAB_00222480;
          }
        }
      }
    }
    uVar8 = (uVar9 >> 10) + 0xd7c0 & 0xffff;
    if ((int)uVar9 < 0x10000) {
      uVar8 = uVar9;
    }
    if ((int)uVar8 < 0xc0) {
      return uVar9;
    }
    if ((ulong)(byte)CollationFCD::tcccIndex[uVar8 >> 5] == 0) {
      return uVar9;
    }
    if ((*(uint *)(CollationFCD::tcccBits + (ulong)(byte)CollationFCD::tcccIndex[uVar8 >> 5] * 4) >>
         (uVar8 & 0x1f) & 1) == 0) {
      return uVar9;
    }
    if ((uVar9 & 0x1fff01) != 0xf01) {
      if ((this->super_UTF8CollationIterator).pos == iVar13) {
        return uVar9;
      }
      UVar7 = nextHasLccc(this);
      if (UVar7 == '\0') {
        return uVar9;
      }
    }
    uVar8 = 0xffffffff;
    if ((((0x7f < uVar9) && (uVar8 = 0xfffffffe, 0x7ff < uVar9)) &&
        (uVar8 = 0xfffffffd, 0xd7ff < uVar9)) && (uVar8 = 0, 0xffefdfff < uVar9 - 0x110000)) {
      uVar8 = uVar9 < 0x10000 | 0xfffffffc;
    }
    piVar2 = &(this->super_UTF8CollationIterator).pos;
    *piVar2 = *piVar2 + uVar8;
    UVar7 = nextSegment(this,errorCode);
    if (UVar7 == '\0') {
      return -1;
    }
  } while( true );
}

Assistant:

UChar32
FCDUTF8CollationIterator::nextCodePoint(UErrorCode &errorCode) {
    UChar32 c;
    for(;;) {
        if(state == CHECK_FWD) {
            if(pos == length || ((c = u8[pos]) == 0 && length < 0)) {
                return U_SENTINEL;
            }
            if(U8_IS_SINGLE(c)) {
                ++pos;
                return c;
            }
            U8_NEXT_OR_FFFD(u8, pos, length, c);
            if(CollationFCD::hasTccc(c <= 0xffff ? c : U16_LEAD(c)) &&
                    (CollationFCD::maybeTibetanCompositeVowel(c) ||
                        (pos != length && nextHasLccc()))) {
                // c is not FCD-inert, therefore it is not U+FFFD and it has a valid byte sequence
                // and we can use U8_LENGTH() rather than a previous-position variable.
                pos -= U8_LENGTH(c);
                if(!nextSegment(errorCode)) {
                    return U_SENTINEL;
                }
                continue;
            }
            return c;
        } else if(state == IN_FCD_SEGMENT && pos != limit) {
            U8_NEXT_OR_FFFD(u8, pos, length, c);
            return c;
        } else if(state == IN_NORMALIZED && pos != normalized.length()) {
            c = normalized.char32At(pos);
            pos += U16_LENGTH(c);
            return c;
        } else {
            switchToForward();
        }
    }
}